

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool __thiscall
cmStringCommand::HandleAppendCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  size_type sVar2;
  char *__s;
  ulong uVar3;
  string *name;
  string value;
  string local_a0;
  string local_80;
  char *local_60;
  undefined8 local_58;
  char local_50;
  undefined7 uStack_4f;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar3 < 0x21) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"sub-command APPEND requires at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_003e9b3f;
  }
  else {
    if (uVar3 == 0x40) goto LAB_003e9b3f;
    name = pbVar1 + 1;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    __s = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    sVar2 = local_a0._M_string_length;
    if (__s != (char *)0x0) {
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)sVar2,(ulong)__s);
    }
    local_40.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_40.Begin._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start + 2;
    local_58 = 0;
    local_50 = '\0';
    local_60 = &local_50;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_80,&local_40,&local_50);
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,name,local_a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_003e9b3f;
  }
  operator_delete(local_a0._M_dataplus._M_p,
                  CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                           local_a0.field_2._M_local_buf[0]) + 1);
LAB_003e9b3f:
  return 0x20 < uVar3;
}

Assistant:

bool cmStringCommand::HandleAppendCommand(std::vector<std::string> const& args)
{
  if(args.size() < 2)
    {
    this->SetError("sub-command APPEND requires at least one argument.");
    return false;
    }

  // Skip if nothing to append.
  if(args.size() < 3)
    {
    return true;
    }

  const std::string& variable = args[1];

  std::string value;
  const char* oldValue = this->Makefile->GetDefinition(variable);
  if(oldValue)
    {
    value = oldValue;
    }
  value += cmJoin(cmMakeRange(args).advance(2), std::string());
  this->Makefile->AddDefinition(variable, value.c_str());
  return true;
}